

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall re2::DFA::PossibleMatchRange(DFA *this,string *min,string *max,int maxlen)

{
  string *prefix;
  bool bVar1;
  mapped_type *pmVar2;
  State *pSVar3;
  State *pSVar4;
  int j_1;
  byte bVar5;
  byte bVar6;
  int j;
  int iVar7;
  State *s;
  int local_ec;
  string *local_e8;
  int local_dc;
  Mutex *local_d8;
  RWLocker l;
  unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  previously_visited_states;
  SearchParams local_88;
  
  if (this->init_failed_ == false) {
    previously_visited_states._M_h._M_buckets = &previously_visited_states._M_h._M_single_bucket;
    previously_visited_states._M_h._M_bucket_count = 1;
    previously_visited_states._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    previously_visited_states._M_h._M_element_count = 0;
    previously_visited_states._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    previously_visited_states._M_h._M_rehash_policy._M_next_resize = 0;
    previously_visited_states._M_h._M_single_bucket = (__node_base_ptr)0x0;
    l.mu_ = &this->cache_mutex_;
    l.writing_ = false;
    Mutex::ReaderLock(l.mu_);
    local_88.text.data_ = (const_pointer)0x0;
    local_88.text.size_ = 0;
    local_88.start = (State *)0x0;
    local_88.context.data_ = (const_pointer)0x0;
    local_88.context.size_._0_7_ = 0;
    local_88.context.size_._7_1_ = 0;
    local_88.want_earliest_match = false;
    local_88.run_forward = false;
    local_88.first_byte = -1;
    local_88.failed = false;
    local_88.ep = (char *)0x0;
    local_88.matches = (SparseSet *)0x0;
    local_88.anchored = true;
    local_88.cache_lock = &l;
    bVar1 = AnalyzeSearch(this,&local_88);
    pSVar4 = local_88.start;
    if ((bVar1) && (local_88.start != (State *)0x2)) {
      if (local_88.start == (State *)0x1) {
        std::__cxx11::string::assign((char *)min);
        bVar1 = true;
        std::__cxx11::string::assign((char *)max);
      }
      else {
        s = local_88.start;
        min->_M_string_length = 0;
        *(min->_M_dataplus)._M_p = '\0';
        local_d8 = &this->mutex_;
        local_e8 = max;
        Mutex::Lock(local_d8);
        local_ec = 0;
        if (maxlen < 1) {
          maxlen = 0;
          local_ec = 0;
        }
        while ((local_ec != maxlen &&
               (pmVar2 = std::__detail::
                         _Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&previously_visited_states,&s), *pmVar2 < 1))) {
          pmVar2 = std::__detail::
                   _Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&previously_visited_states,&s);
          *pmVar2 = *pmVar2 + 1;
          pSVar3 = RunStateOnByte(this,s,0x100);
          if (pSVar3 != (State *)0x1) {
            if (pSVar3 == (State *)0x0) {
LAB_001b11be:
              bVar1 = false;
              goto LAB_001b11d4;
            }
            if ((pSVar3 == (State *)0x2) || ((pSVar3->flag_ & 0x100) != 0)) break;
          }
          iVar7 = 0;
          while( true ) {
            if (iVar7 == 0x100) goto LAB_001b10d3;
            pSVar3 = RunStateOnByte(this,s,iVar7);
            if (pSVar3 == (State *)0x0) goto LAB_001b11be;
            if ((pSVar3 == (State *)0x2) || (((State *)0x2 < pSVar3 && (0 < pSVar3->ninst_))))
            break;
            iVar7 = iVar7 + 1;
          }
          std::__cxx11::string::append((ulong)min,'\x01');
          local_ec = local_ec + 1;
          s = pSVar3;
        }
LAB_001b10d3:
        std::
        _Hashtable<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear(&previously_visited_states._M_h);
        s = pSVar4;
        local_e8->_M_string_length = 0;
        *(local_e8->_M_dataplus)._M_p = '\0';
        iVar7 = 0;
        bVar1 = false;
        local_dc = maxlen;
        while ((prefix = local_e8, local_ec = iVar7, iVar7 != local_dc &&
               (pmVar2 = std::__detail::
                         _Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&previously_visited_states,&s), *pmVar2 < 1))) {
          pmVar2 = std::__detail::
                   _Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&previously_visited_states,&s);
          *pmVar2 = *pmVar2 + 1;
          iVar7 = 0xff;
          while( true ) {
            bVar6 = (byte)((uint)iVar7 >> 0x1f);
            bVar5 = 1;
            if (iVar7 < 0) break;
            pSVar4 = RunStateOnByte(this,s,iVar7);
            if (pSVar4 == (State *)0x0) {
              bVar1 = false;
              break;
            }
            if ((pSVar4 == (State *)0x2) || (((State *)0x2 < pSVar4 && (0 < pSVar4->ninst_)))) {
              std::__cxx11::string::append((ulong)local_e8,'\x01');
              bVar6 = 1;
              bVar5 = 0;
              s = pSVar4;
              break;
            }
            iVar7 = iVar7 + -1;
          }
          bVar1 = (bool)(bVar6 & bVar5 | bVar1);
          if ((bVar6 == 0) || (iVar7 = local_ec + 1, bVar5 != 0)) goto LAB_001b11d4;
        }
        PrefixSuccessor(prefix);
        bVar1 = prefix->_M_string_length != 0;
LAB_001b11d4:
        Mutex::Unlock(local_d8);
      }
    }
    else {
      bVar1 = false;
    }
    RWLocker::~RWLocker(&l);
    std::
    _Hashtable<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&previously_visited_states._M_h);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DFA::PossibleMatchRange(std::string* min, std::string* max, int maxlen) {
  if (!ok())
    return false;

  // NOTE: if future users of PossibleMatchRange want more precision when
  // presented with infinitely repeated elements, consider making this a
  // parameter to PossibleMatchRange.
  static int kMaxEltRepetitions = 0;

  // Keep track of the number of times we've visited states previously. We only
  // revisit a given state if it's part of a repeated group, so if the value
  // portion of the map tuple exceeds kMaxEltRepetitions we bail out and set
  // |*max| to |PrefixSuccessor(*max)|.
  //
  // Also note that previously_visited_states[UnseenStatePtr] will, in the STL
  // tradition, implicitly insert a '0' value at first use. We take advantage
  // of that property below.
  std::unordered_map<State*, int> previously_visited_states;

  // Pick out start state for anchored search at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(StringPiece(), StringPiece(), &l);
  params.anchored = true;
  if (!AnalyzeSearch(&params))
    return false;
  if (params.start == DeadState) {  // No matching strings
    *min = "";
    *max = "";
    return true;
  }
  if (params.start == FullMatchState)  // Every string matches: no max
    return false;

  // The DFA is essentially a big graph rooted at params.start,
  // and paths in the graph correspond to accepted strings.
  // Each node in the graph has potentially 256+1 arrows
  // coming out, one for each byte plus the magic end of
  // text character kByteEndText.

  // To find the smallest possible prefix of an accepted
  // string, we just walk the graph preferring to follow
  // arrows with the lowest bytes possible.  To find the
  // largest possible prefix, we follow the largest bytes
  // possible.

  // The test for whether there is an arrow from s on byte j is
  //    ns = RunStateOnByteUnlocked(s, j);
  //    if (ns == NULL)
  //      return false;
  //    if (ns != DeadState && ns->ninst > 0)
  // The RunStateOnByteUnlocked call asks the DFA to build out the graph.
  // It returns NULL only if the DFA has run out of memory,
  // in which case we can't be sure of anything.
  // The second check sees whether there was graph built
  // and whether it is interesting graph.  Nodes might have
  // ns->ninst == 0 if they exist only to represent the fact
  // that a match was found on the previous byte.

  // Build minimum prefix.
  State* s = params.start;
  min->clear();
  MutexLock lock(&mutex_);
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions)
      break;
    previously_visited_states[s]++;

    // Stop if min is a match.
    State* ns = RunStateOnByte(s, kByteEndText);
    if (ns == NULL)  // DFA out of memory
      return false;
    if (ns != DeadState && (ns == FullMatchState || ns->IsMatch()))
      break;

    // Try to extend the string with low bytes.
    bool extended = false;
    for (int j = 0; j < 256; j++) {
      ns = RunStateOnByte(s, j);
      if (ns == NULL)  // DFA out of memory
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        min->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended)
      break;
  }

  // Build maximum prefix.
  previously_visited_states.clear();
  s = params.start;
  max->clear();
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions)
      break;
    previously_visited_states[s] += 1;

    // Try to extend the string with high bytes.
    bool extended = false;
    for (int j = 255; j >= 0; j--) {
      State* ns = RunStateOnByte(s, j);
      if (ns == NULL)
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        max->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended) {
      // Done, no need for PrefixSuccessor.
      return true;
    }
  }

  // Stopped while still adding to *max - round aaaaaaaaaa... to aaaa...b
  PrefixSuccessor(max);

  // If there are no bytes left, we have no way to say "there is no maximum
  // string".  We could make the interface more complicated and be able to
  // return "there is no maximum but here is a minimum", but that seems like
  // overkill -- the most common no-max case is all possible strings, so not
  // telling the caller that the empty string is the minimum match isn't a
  // great loss.
  if (max->empty())
    return false;

  return true;
}